

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::Draw
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,DrawAttribs *Attribs,int param_2)

{
  String *__return_storage_ptr__;
  PRIMITIVE_TOPOLOGY Topology_00;
  DRAW_FLAGS DVar1;
  bool bVar2;
  COMMAND_QUEUE_TYPE CVar3;
  Uint32 UVar4;
  Char *pCVar5;
  PipelineStateGLImpl *pPVar6;
  PipelineStateDesc *pPVar7;
  GraphicsPipelineDesc *pGVar8;
  COMMAND_QUEUE_TYPE Type;
  char *in_R8;
  char (*in_R9) [8];
  undefined1 local_110 [7];
  PRIMITIVE_TOPOLOGY Topology;
  string msg_5;
  string msg_4;
  string msg_3;
  undefined1 local_90 [8];
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  int param_2_local;
  DrawAttribs *Attribs_local;
  DeviceContextBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._12_4_ = param_2;
  DVar1 = Diligent::operator&(Attribs->Flags,DRAW_FLAG_VERIFY_DRAW_ATTRIBS);
  if (DVar1 != DRAW_FLAG_NONE) {
    if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
      bVar2 = IsDeferred(this);
      if (!bVar2) {
        FormatString<char[79]>
                  ((string *)local_40,
                   (char (*) [79])
                   "Queue type may never be unknown for immediate contexts. This looks like a bug.")
        ;
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"Draw",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x8d8);
        std::__cxx11::string::~string((string *)local_40);
      }
      FormatString<char[97]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [97])
                 "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
                );
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"Draw",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8d8);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    CVar3 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_GRAPHICS);
    if (CVar3 != COMMAND_QUEUE_TYPE_GRAPHICS) {
      __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
      GetCommandQueueTypeString_abi_cxx11_
                (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
      in_R8 = " queue.";
      FormatString<char[5],char[22],std::__cxx11::string,char[8]>
                ((string *)local_90,(Diligent *)0xe52bca,(char (*) [5])0xf4cb59,
                 (char (*) [22])__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
                 in_R9);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"Draw",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8d8);
      std::__cxx11::string::~string((string *)local_90);
    }
    bVar2 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator!(&this->m_pPipelineState);
    if (bVar2) {
      FormatString<char[64]>((string *)((long)&msg_4.field_2 + 8),(char (*) [64])0xe5474b);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"Draw",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8da);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
    pPVar6 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->(&this->m_pPipelineState);
    pPVar7 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetDesc
                       (&pPVar6->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
    if (pPVar7->PipelineType != PIPELINE_TYPE_GRAPHICS) {
      pPVar6 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->(&this->m_pPipelineState);
      pPVar7 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetDesc
                         (&pPVar6->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
      FormatString<char[53],char_const*,char[30]>
                ((string *)((long)&msg_5.field_2 + 8),(Diligent *)0xe54790,(char (*) [53])pPVar7,
                 (char **)"\' is not a graphics pipeline.",(char (*) [30])in_R8);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"Draw",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8dd);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
    }
    bVar2 = VerifyDrawAttribs(Attribs);
    if (!bVar2) {
      FormatString<char[24]>((string *)local_110,(char (*) [24])0xe547ca);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"Draw",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8df);
      std::__cxx11::string::~string((string *)local_110);
    }
  }
  bVar2 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&this->m_pPipelineState);
  if (bVar2) {
    pPVar6 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->(&this->m_pPipelineState);
    pGVar8 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                       (&pPVar6->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
    Topology_00 = pGVar8->PrimitiveTopology;
    UVar4 = GetPrimitiveCount(Topology_00,Attribs->NumVertices);
    (this->m_Stats).PrimitiveCounts[Topology_00] =
         UVar4 + (this->m_Stats).PrimitiveCounts[Topology_00];
  }
  (this->m_Stats).CommandCounters.Draw = (this->m_Stats).CommandCounters.Draw + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::Draw(const DrawAttribs& Attribs, int)
{
#ifdef DILIGENT_DEVELOPMENT
    if ((Attribs.Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != 0)
    {
        DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "Draw");

        DEV_CHECK_ERR(m_pPipelineState, "Draw command arguments are invalid: no pipeline state is bound.");

        DEV_CHECK_ERR(m_pPipelineState->GetDesc().PipelineType == PIPELINE_TYPE_GRAPHICS,
                      "Draw command arguments are invalid: pipeline state '", m_pPipelineState->GetDesc().Name, "' is not a graphics pipeline.");

        DEV_CHECK_ERR(VerifyDrawAttribs(Attribs), "DrawAttribs are invalid");
    }
#endif
    if (m_pPipelineState)
    {
        const PRIMITIVE_TOPOLOGY Topology = m_pPipelineState->GetGraphicsPipelineDesc().PrimitiveTopology;
        m_Stats.PrimitiveCounts[Topology] += GetPrimitiveCount(Topology, Attribs.NumVertices);
    }
    ++m_Stats.CommandCounters.Draw;
}